

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Ses_StoreGetEntrySimple
              (Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  Ses_TimesEntry_t *pSVar1;
  uint uVar2;
  Ses_TimesEntry_t *pSVar3;
  ulong uVar4;
  Ses_TruthEntry_t *pSVar5;
  Ses_TimesEntry_t *pSVar6;
  uint uVar7;
  
  uVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 ^ *(int *)(Ses_StoreTableHash_s_Primes + (ulong)((uint)uVar4 & 0xf) * 4) *
                      (int)pTruth[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    uVar4 = (ulong)(uVar7 & 0x3ff);
  }
  pSVar5 = pStore->pEntries[uVar4];
  if (pSVar5 == (Ses_TruthEntry_t *)0x0) {
    return 0;
  }
  do {
    if (pSVar5->nVars == nVars) {
      if ((int)uVar2 < 1) {
LAB_002ba965:
        pSVar1 = pSVar5->head;
        if (pSVar1 == (Ses_TimesEntry_t *)0x0) {
          return 0;
        }
        pSVar6 = pSVar1;
        while (pSVar3 = pSVar1, 0 < nVars) {
          uVar4 = 0;
          while (pArrTimeProfile[uVar4] == pSVar6->pArrTimeProfile[uVar4]) {
            uVar4 = uVar4 + 1;
            pSVar3 = pSVar6;
            if ((uint)nVars == uVar4) goto LAB_002ba99d;
          }
          pSVar6 = pSVar6->next;
          if (pSVar6 == (Ses_TimesEntry_t *)0x0) {
            return 0;
          }
        }
LAB_002ba99d:
        *pSol = pSVar3->pNetwork;
        return 1;
      }
      uVar4 = 0;
      while (pSVar5->pTruth[uVar4] == pTruth[uVar4]) {
        uVar4 = uVar4 + 1;
        if (uVar2 == uVar4) goto LAB_002ba965;
      }
    }
    pSVar5 = pSVar5->next;
    if (pSVar5 == (Ses_TruthEntry_t *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

int Ses_StoreGetEntrySimple( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}